

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall Application::draw_frame(Application *this)

{
  shared_ptr<myvk::CommandBuffer> *command_buffer;
  uint32_t current_frame;
  uint uVar1;
  uint uVar2;
  element_type *peVar3;
  pointer psVar4;
  pointer psVar5;
  CommandBuffer *this_00;
  bool bVar6;
  initializer_list<VkClearValue> __l;
  allocator_type local_61;
  vector<VkClearValue,_std::allocator<VkClearValue>_> local_60;
  VkClearValue local_48;
  
  bVar6 = myvk::FrameManager::NewFrame
                    ((this->m_frame_manager).
                     super___shared_ptr<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (bVar6) {
    peVar3 = (this->m_frame_manager).
             super___shared_ptr<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    current_frame = peVar3->m_current_frame;
    uVar1 = peVar3->m_current_image_index;
    if (this->m_ui_state == kOctreeTracer) {
      Camera::UpdateFrameUniformBuffer
                ((this->m_camera).super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 current_frame);
    }
    peVar3 = (this->m_frame_manager).
             super___shared_ptr<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar2 = peVar3->m_current_frame;
    psVar4 = (peVar3->m_frame_command_buffers).
             super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    command_buffer = psVar4 + uVar2;
    myvk::CommandPool::Reset
              (*(CommandPool **)
                (*(long *)&psVar4[uVar2].
                           super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2> +
                0x18),0);
    myvk::CommandBuffer::Begin
              (psVar4[uVar2].super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,0);
    if ((this->m_ui_state != kPathTracing) &&
       ((((this->m_octree).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_buffer)
        .super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
       ) {
      OctreeTracer::CmdBeamRenderPass
                ((this->m_octree_tracer).
                 super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,command_buffer,
                 current_frame);
    }
    psVar5 = (this->m_framebuffers).
             super__Vector_base<std::shared_ptr<myvk::Framebuffer>,_std::allocator<std::shared_ptr<myvk::Framebuffer>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    local_48.depthStencil.depth = 0.0;
    local_48.depthStencil.stencil = 0;
    local_48._8_8_ = 0x3f80000000000000;
    __l._M_len = 1;
    __l._M_array = &local_48;
    std::vector<VkClearValue,_std::allocator<VkClearValue>_>::vector(&local_60,__l,&local_61);
    myvk::CommandBuffer::CmdBeginRenderPass
              (this_00,&this->m_render_pass,psVar5 + uVar1,&local_60,VK_SUBPASS_CONTENTS_INLINE);
    if (local_60.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (this->m_ui_state == kPathTracing) {
      PathTracerViewer::CmdDrawPipeline
                ((this->m_path_tracer_viewer).
                 super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 command_buffer,current_frame);
    }
    else if ((((this->m_octree).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0) {
      OctreeTracer::CmdDrawPipeline
                ((this->m_octree_tracer).
                 super___shared_ptr<OctreeTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,command_buffer,
                 current_frame);
    }
    myvk::CommandBuffer::CmdNextSubpass
              ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr,VK_SUBPASS_CONTENTS_INLINE);
    myvk::ImGuiRenderer::CmdDrawPipeline
              ((this->m_imgui_renderer).
               super___shared_ptr<myvk::ImGuiRenderer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               command_buffer,current_frame);
    myvk::CommandBuffer::CmdEndRenderPass
              ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr);
    myvk::CommandBuffer::End
              ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr);
    myvk::FrameManager::Render
              ((this->m_frame_manager).
               super___shared_ptr<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void Application::draw_frame() {
	if (!m_frame_manager->NewFrame())
		return;

	uint32_t image_index = m_frame_manager->GetCurrentImageIndex();
	uint32_t current_frame = m_frame_manager->GetCurrentFrame();
	if (m_ui_state == UIStates::kOctreeTracer)
		m_camera->UpdateFrameUniformBuffer(current_frame);

	const std::shared_ptr<myvk::CommandBuffer> &command_buffer = m_frame_manager->GetCurrentCommandBuffer();

	command_buffer->GetCommandPoolPtr()->Reset();
	command_buffer->Begin();

	if (m_ui_state != UIStates::kPathTracing && !m_octree->Empty()) {
		m_octree_tracer->CmdBeamRenderPass(command_buffer, current_frame);
	}
	command_buffer->CmdBeginRenderPass(m_render_pass, m_framebuffers[image_index], {{{0.0f, 0.0f, 0.0f, 1.0f}}});
	if (m_ui_state == UIStates::kPathTracing) {
		m_path_tracer_viewer->CmdDrawPipeline(command_buffer, current_frame);
	} else if (!m_octree->Empty()) {
		m_octree_tracer->CmdDrawPipeline(command_buffer, current_frame);
	}
	command_buffer->CmdNextSubpass();
	m_imgui_renderer->CmdDrawPipeline(command_buffer, current_frame);
	command_buffer->CmdEndRenderPass();
	command_buffer->End();

	m_frame_manager->Render();
}